

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O0

bool duckdb::ApproxQuantileCoding::Decode<double,unsigned_long>
               (double *source,unsigned_long *target)

{
  bool bVar1;
  unsigned_long uVar2;
  uint64_t *in_RSI;
  double *in_RDI;
  undefined1 local_1;
  
  bVar1 = TryCast::Operation<double,unsigned_long>((double)in_RDI,in_RSI,false);
  if (bVar1) {
    local_1 = true;
  }
  else {
    if (0.0 < *in_RDI || *in_RDI == 0.0) {
      uVar2 = NumericLimits<unsigned_long>::Maximum();
      *in_RSI = uVar2;
    }
    else {
      uVar2 = NumericLimits<unsigned_long>::Minimum();
      *in_RSI = uVar2;
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool Decode(const SAVE_TYPE &source, TARGET_TYPE &target) {
		// The result is approximate, so clamp instead of overflowing.
		if (TryCast::Operation(source, target, false)) {
			return true;
		} else if (source < 0) {
			target = NumericLimits<TARGET_TYPE>::Minimum();
		} else {
			target = NumericLimits<TARGET_TYPE>::Maximum();
		}
		return false;
	}